

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O3

void __thiscall
rr::TriangleRasterizer::rasterize
          (TriangleRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  Vec4 *pVVar1;
  float fVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  TriangleRasterizer *pTVar8;
  int iVar9;
  long *plVar10;
  long lVar11;
  ulong uVar12;
  byte bVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  undefined8 *puVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  long *plVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float afStack_728 [4];
  undefined8 uStack_718;
  float fStack_710;
  float fStack_70c;
  float afStack_708 [4];
  TriangleRasterizer *pTStack_6f8;
  ulong uStack_6f0;
  ulong uStack_6e8;
  long lStack_6e0;
  long lStack_6d8;
  long lStack_6d0;
  long lStack_6c8;
  long lStack_6c0;
  long lStack_6b8;
  long lStack_6b0;
  long lStack_6a8;
  long lStack_6a0;
  int *piStack_698;
  FragmentPacket *pFStack_690;
  float *pfStack_688;
  long lStack_680;
  long alStack_678 [4];
  long alStack_658 [2];
  int iStack_648;
  int iStack_644;
  long lStack_640;
  undefined8 uStack_638;
  long alStack_630 [60];
  long alStack_450 [64];
  long alStack_250 [68];
  
  switch(this->m_numSamples) {
  case 1:
    rasterizeSingleSample(this,fragmentPackets,depthValues,maxFragmentPackets,numPacketsRasterized);
    return;
  case 2:
    rasterizeMultiSample<2>
              (this,fragmentPackets,depthValues,maxFragmentPackets,numPacketsRasterized);
    return;
  case 3:
  case 5:
  case 6:
  case 7:
    goto switchD_0059e9cd_caseD_3;
  case 4:
    rasterizeMultiSample<4>
              (this,fragmentPackets,depthValues,maxFragmentPackets,numPacketsRasterized);
    return;
  case 8:
    rasterizeMultiSample<8>
              (this,fragmentPackets,depthValues,maxFragmentPackets,numPacketsRasterized);
    return;
  default:
    if (this->m_numSamples == 0x10) {
      uVar16 = (this->m_curPos).m_data[1];
      iVar21 = (this->m_bboxMax).m_data[1];
      iVar22 = 0;
      piStack_698 = numPacketsRasterized;
      if (0 < maxFragmentPackets && (int)uVar16 <= iVar21) {
        fVar2 = (this->m_v2).m_data[2];
        fVar40 = (this->m_v0).m_data[2] - fVar2;
        fVar41 = (this->m_v1).m_data[2] - fVar2;
        iVar22 = 0;
        pTStack_6f8 = this;
        pFStack_690 = fragmentPackets;
        pfStack_688 = depthValues;
        do {
          pTVar8 = pTStack_6f8;
          uStack_6e8 = (ulong)uVar16;
          uVar3 = (pTStack_6f8->m_curPos).m_data[0];
          uStack_6f0 = (ulong)uVar3;
          alStack_678[0] = (long)(int)(uVar16 << 8);
          iVar14 = uVar16 + 1;
          alStack_678[2] = (long)(iVar14 * 0x100);
          iVar18 = uVar3 + 1;
          uStack_638._0_4_ = iVar18 * 0x100;
          uStack_638._4_4_ = -(uint)((int)uStack_638 < 0);
          alStack_658[0] = CONCAT44(-(uint)((int)(uVar3 << 8) < 0),uVar3 << 8);
          _iStack_648 = CONCAT44(uStack_638._4_4_,(int)uStack_638);
          iVar9 = (pTStack_6f8->m_viewport).m_data[2] + (pTStack_6f8->m_viewport).m_data[0];
          iVar15 = (pTStack_6f8->m_viewport).m_data[3] + (pTStack_6f8->m_viewport).m_data[1];
          plVar10 = alStack_250 + 3;
          alStack_678[1] = alStack_678[0];
          alStack_678[3] = alStack_678[2];
          memset(plVar10,0,0x200);
          plVar28 = alStack_450 + 3;
          memset(plVar28,0,0x200);
          puVar19 = &uStack_638;
          memset(puVar19,0,0x200);
          lStack_6a0 = (pTVar8->m_edge01).a;
          lStack_6b8 = (pTVar8->m_edge01).b;
          lStack_6c0 = (pTVar8->m_edge01).c;
          lStack_6c8 = (pTVar8->m_edge12).a;
          lStack_6d0 = (pTVar8->m_edge12).b;
          lStack_6d8 = (pTVar8->m_edge12).c;
          lStack_6a8 = (pTVar8->m_edge20).a;
          lStack_6e0 = (pTVar8->m_edge20).b;
          lStack_6b0 = (pTVar8->m_edge20).c;
          lVar25 = 0;
          do {
            lStack_680 = lVar25;
            lVar25 = (&s_samplePos16)[lStack_680 * 2];
            lVar27 = (&DAT_00687328)[lStack_680 * 2];
            lVar20 = 0;
            do {
              lVar23 = alStack_658[lVar20] + lVar25;
              lVar11 = alStack_678[lVar20] + lVar27;
              plVar10[lVar20] = lStack_6b8 * lVar11 + lStack_6a0 * lVar23 + lStack_6c0;
              plVar28[lVar20] = lStack_6d0 * lVar11 + lStack_6c8 * lVar23 + lStack_6d8;
              puVar19[lVar20] = lVar11 * lStack_6e0 + lVar23 * lStack_6a8 + lStack_6b0;
              lVar20 = lVar20 + 1;
            } while (lVar20 != 4);
            puVar19 = puVar19 + 4;
            plVar28 = plVar28 + 4;
            plVar10 = plVar10 + 4;
            lVar25 = lStack_680 + 1;
          } while (lStack_680 + 1 != 0x10);
          uVar26 = (ulong)(pTStack_6f8->m_edge01).inclusive;
          lVar27 = -uVar26;
          uVar29 = (ulong)(pTStack_6f8->m_edge12).inclusive;
          lVar20 = -uVar29;
          uVar24 = (ulong)(pTStack_6f8->m_edge20).inclusive;
          lVar25 = -uVar24;
          lVar11 = 0x18;
          uVar17 = 0;
          uVar30 = 0;
          do {
            lVar23 = *(long *)((long)alStack_250 + lVar11);
            if ((lVar23 == lVar27 || SBORROW8(lVar23,lVar27) != (long)(lVar23 + uVar26) < 0) ||
               (lVar23 = *(long *)((long)alStack_450 + lVar11),
               lVar23 == lVar20 || SBORROW8(lVar23,lVar20) != (long)(lVar23 + uVar29) < 0)) {
              uVar31 = uVar30 & ~(1L << (uVar17 & 0x3f));
            }
            else {
              lVar23 = *(long *)((long)alStack_658 + lVar11 + 8);
              uVar31 = uVar30 & ~(1L << (uVar17 & 0x3f));
              if (lVar23 != lVar25 && SBORROW8(lVar23,lVar25) == (long)(lVar23 + uVar24) < 0) {
                uVar31 = uVar30 | 1L << (uVar17 & 0x3f);
              }
            }
            bVar13 = (byte)uVar17;
            if (((iVar18 == iVar9) ||
                (lVar23 = *(long *)((long)alStack_250 + lVar11 + 8),
                lVar23 == lVar27 || SBORROW8(lVar23,lVar27) != (long)(lVar23 + uVar26) < 0)) ||
               (lVar23 = *(long *)((long)alStack_450 + lVar11 + 8),
               lVar23 == lVar20 || SBORROW8(lVar23,lVar20) != (long)(lVar23 + uVar29) < 0)) {
              uVar30 = uVar31 & ~(0x100000000 << (bVar13 & 0x3f));
            }
            else {
              uVar12 = 0x100000000 << (bVar13 & 0x3f);
              lVar23 = *(long *)((long)&iStack_648 + lVar11);
              uVar30 = ~uVar12 & uVar31;
              if (lVar23 != lVar25 && SBORROW8(lVar23,lVar25) == (long)(lVar23 + uVar24) < 0) {
                uVar30 = uVar31 | uVar12;
              }
            }
            if (((iVar14 == iVar15) ||
                (lVar23 = *(long *)((long)alStack_250 + lVar11 + 0x10),
                lVar23 == lVar27 || SBORROW8(lVar23,lVar27) != (long)(lVar23 + uVar26) < 0)) ||
               (lVar23 = *(long *)((long)alStack_450 + lVar11 + 0x10),
               lVar23 == lVar20 || SBORROW8(lVar23,lVar20) != (long)(lVar23 + uVar29) < 0)) {
              uVar31 = uVar30 & ~(0x10000L << (bVar13 & 0x3f));
            }
            else {
              uVar12 = 0x10000L << (bVar13 & 0x3f);
              lVar23 = *(long *)((long)&lStack_640 + lVar11);
              uVar31 = ~uVar12 & uVar30;
              if (lVar23 != lVar25 && SBORROW8(lVar23,lVar25) == (long)(lVar23 + uVar24) < 0) {
                uVar31 = uVar30 | uVar12;
              }
            }
            if (((iVar14 == iVar15 || iVar18 == iVar9) ||
                (lVar23 = *(long *)((long)alStack_250 + lVar11 + 0x18),
                lVar23 == lVar27 || SBORROW8(lVar23,lVar27) != (long)(lVar23 + uVar26) < 0)) ||
               (lVar23 = *(long *)((long)alStack_450 + lVar11 + 0x18),
               lVar23 == lVar20 || SBORROW8(lVar23,lVar20) != (long)(lVar23 + uVar29) < 0)) {
              uVar30 = uVar31 & ~(0x1000000000000 << (bVar13 & 0x3f));
            }
            else {
              uVar12 = 0x1000000000000 << (bVar13 & 0x3f);
              lVar23 = *(long *)((long)alStack_630 + lVar11 + -8);
              uVar30 = ~uVar12 & uVar31;
              if (lVar23 != lVar25 && SBORROW8(lVar23,lVar25) == (long)(lVar23 + uVar24) < 0) {
                uVar30 = uVar31 | uVar12;
              }
            }
            uVar17 = uVar17 + 1;
            lVar11 = lVar11 + 0x20;
          } while (uVar17 != 0x10);
          iVar9 = (int)uStack_6f0 + 2;
          (pTStack_6f8->m_curPos).m_data[0] = iVar9;
          uVar16 = (uint)uStack_6e8;
          if ((pTStack_6f8->m_bboxMax).m_data[0] < iVar9) {
            uVar16 = uVar16 + 2;
            (pTStack_6f8->m_curPos).m_data[1] = uVar16;
            (pTStack_6f8->m_curPos).m_data[0] = (pTStack_6f8->m_bboxMin).m_data[0];
          }
          if (uVar30 != 0) {
            if (pfStack_688 != (float *)0x0) {
              puVar19 = &uStack_638;
              plVar10 = alStack_450 + 3;
              plVar28 = alStack_250 + 3;
              lVar25 = 0;
              do {
                afStack_708[0] = 0.0;
                afStack_708[1] = 0.0;
                afStack_708[2] = 0.0;
                afStack_708[3] = 0.0;
                lVar27 = 0;
                do {
                  *(ulong *)(afStack_708 + lVar27) =
                       CONCAT44((float)plVar28[lVar27 + 1],(float)plVar28[lVar27]);
                  lVar27 = lVar27 + 2;
                } while (lVar27 != 4);
                uStack_718._0_4_ = 0.0;
                uStack_718._4_4_ = 0.0;
                fStack_710 = 0.0;
                fStack_70c = 0.0;
                lVar27 = 0;
                do {
                  *(ulong *)((long)&uStack_718 + lVar27 * 4) =
                       CONCAT44((float)plVar10[lVar27 + 1],(float)plVar10[lVar27]);
                  lVar27 = lVar27 + 2;
                } while (lVar27 != 4);
                afStack_728[0] = 0.0;
                afStack_728[1] = 0.0;
                afStack_728[2] = 0.0;
                afStack_728[3] = 0.0;
                lVar27 = 0;
                do {
                  *(ulong *)(afStack_728 + lVar27) =
                       CONCAT44((float)(long)puVar19[lVar27 + 1],(float)(long)puVar19[lVar27]);
                  lVar27 = lVar27 + 2;
                } while (lVar27 != 4);
                auVar7._4_4_ = uStack_718._4_4_;
                auVar7._0_4_ = (float)uStack_718;
                auVar7._8_4_ = fStack_710;
                auVar7._12_4_ = fStack_70c;
                auVar6._4_4_ = afStack_728[1];
                auVar6._0_4_ = afStack_728[0];
                auVar6._8_4_ = afStack_728[2];
                auVar6._12_4_ = afStack_728[3];
                afStack_728[0] = afStack_708[0] + (float)uStack_718 + afStack_728[0];
                afStack_728[1] = afStack_708[1] + uStack_718._4_4_ + afStack_728[1];
                afStack_728[2] = afStack_708[2] + fStack_710 + afStack_728[2];
                afStack_728[3] = afStack_708[3] + fStack_70c + afStack_728[3];
                auVar32._4_4_ = afStack_728[1];
                auVar32._0_4_ = afStack_728[0];
                auVar32._8_4_ = afStack_728[2];
                auVar32._12_4_ = afStack_728[3];
                auVar32 = divps(auVar7,auVar32);
                auVar34._4_4_ = afStack_728[1];
                auVar34._0_4_ = afStack_728[0];
                auVar34._8_4_ = afStack_728[2];
                auVar34._12_4_ = afStack_728[3];
                auVar34 = divps(auVar6,auVar34);
                lVar27 = lVar25 + (iVar22 << 6);
                pfStack_688[lVar27] = auVar32._0_4_ * fVar40 + fVar41 * auVar34._0_4_ + fVar2;
                pfStack_688[lVar27 + 0x10] = auVar32._4_4_ * fVar40 + auVar34._4_4_ * fVar41 + fVar2
                ;
                pfStack_688[lVar27 + 0x20] = auVar32._8_4_ * fVar40 + auVar34._8_4_ * fVar41 + fVar2
                ;
                pfStack_688[lVar27 + 0x30] =
                     auVar32._12_4_ * fVar40 + auVar34._12_4_ * fVar41 + fVar2;
                lVar25 = lVar25 + 1;
                plVar28 = plVar28 + 4;
                plVar10 = plVar10 + 4;
                puVar19 = puVar19 + 4;
              } while (lVar25 != 0x10);
            }
            afStack_708[0] = 0.0;
            afStack_708[1] = 0.0;
            afStack_708[2] = 0.0;
            afStack_708[3] = 0.0;
            uStack_718._0_4_ = 0.0;
            uStack_718._4_4_ = 0.0;
            fStack_710 = 0.0;
            fStack_70c = 0.0;
            afStack_728[0] = 0.0;
            afStack_728[1] = 0.0;
            afStack_728[2] = 0.0;
            afStack_728[3] = 0.0;
            lVar25 = 0;
            do {
              lVar27 = *(long *)((long)alStack_658 + lVar25 * 2) + 0x80;
              lVar20 = *(long *)((long)alStack_678 + lVar25 * 2) + 0x80;
              *(float *)((long)afStack_708 + lVar25) =
                   (float)(lStack_6b8 * lVar20 + lStack_6a0 * lVar27 + lStack_6c0);
              *(float *)((long)&uStack_718 + lVar25) =
                   (float)(lStack_6d0 * lVar20 + lStack_6c8 * lVar27 + lStack_6d8);
              *(float *)((long)afStack_728 + lVar25) =
                   (float)(lVar20 * lStack_6e0 + lVar27 * lStack_6a8 + lStack_6b0);
              lVar25 = lVar25 + 4;
            } while (lVar25 != 0x10);
            fVar39 = (pTStack_6f8->m_v0).m_data[3];
            auVar33._0_4_ = fVar39 * (float)uStack_718;
            auVar33._4_4_ = fVar39 * uStack_718._4_4_;
            auVar33._8_4_ = fVar39 * fStack_710;
            auVar33._12_4_ = fVar39 * fStack_70c;
            fVar39 = (pTStack_6f8->m_v1).m_data[3];
            auVar35._0_4_ = fVar39 * afStack_728[0];
            auVar35._4_4_ = fVar39 * afStack_728[1];
            auVar35._8_4_ = fVar39 * afStack_728[2];
            auVar35._12_4_ = fVar39 * afStack_728[3];
            fVar39 = (pTStack_6f8->m_v2).m_data[3];
            fVar36 = auVar33._0_4_ + auVar35._0_4_ + fVar39 * afStack_708[0];
            fVar37 = auVar33._4_4_ + auVar35._4_4_ + fVar39 * afStack_708[1];
            fVar38 = auVar33._8_4_ + auVar35._8_4_ + fVar39 * afStack_708[2];
            fVar39 = auVar33._12_4_ + auVar35._12_4_ + fVar39 * afStack_708[3];
            *(ulong *)pFStack_690[iVar22].position.m_data = (uStack_6e8 << 0x20) + uStack_6f0;
            pFStack_690[iVar22].coverage = uVar30;
            auVar4._4_4_ = fVar37;
            auVar4._0_4_ = fVar36;
            auVar4._8_4_ = fVar38;
            auVar4._12_4_ = fVar39;
            auVar32 = divps(auVar33,auVar4);
            *(undefined1 (*) [16])pFStack_690[iVar22].barycentric[0].m_data = auVar32;
            auVar5._4_4_ = fVar37;
            auVar5._0_4_ = fVar36;
            auVar5._8_4_ = fVar38;
            auVar5._12_4_ = fVar39;
            auVar34 = divps(auVar35,auVar5);
            *(undefined1 (*) [16])pFStack_690[iVar22].barycentric[1].m_data = auVar34;
            pVVar1 = pFStack_690[iVar22].barycentric + 2;
            pVVar1->m_data[0] = (1.0 - auVar32._0_4_) - auVar34._0_4_;
            pVVar1->m_data[1] = (1.0 - auVar32._4_4_) - auVar34._4_4_;
            pVVar1->m_data[2] = (1.0 - auVar32._8_4_) - auVar34._8_4_;
            pVVar1->m_data[3] = (1.0 - auVar32._12_4_) - auVar34._12_4_;
            iVar22 = iVar22 + 1;
            iVar21 = (pTStack_6f8->m_bboxMax).m_data[1];
            uVar16 = (pTStack_6f8->m_curPos).m_data[1];
          }
        } while (((int)uVar16 <= iVar21) && (iVar22 < maxFragmentPackets));
      }
      *piStack_698 = iVar22;
      return;
    }
switchD_0059e9cd_caseD_3:
    return;
  }
}

Assistant:

void TriangleRasterizer::rasterize (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	switch (m_numSamples)
	{
		case 1:		rasterizeSingleSample		(fragmentPackets, depthValues, maxFragmentPackets, numPacketsRasterized);	break;
		case 2:		rasterizeMultiSample<2>		(fragmentPackets, depthValues, maxFragmentPackets, numPacketsRasterized);	break;
		case 4:		rasterizeMultiSample<4>		(fragmentPackets, depthValues, maxFragmentPackets, numPacketsRasterized);	break;
		case 8:		rasterizeMultiSample<8>		(fragmentPackets, depthValues, maxFragmentPackets, numPacketsRasterized);	break;
		case 16:	rasterizeMultiSample<16>	(fragmentPackets, depthValues, maxFragmentPackets, numPacketsRasterized);	break;
		default:
			DE_ASSERT(DE_FALSE);
	}
}